

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O1

void ucase(char *cp)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  
  if ((cp != (char *)0x0) && (cVar1 = *cp, cVar1 != '\0')) {
    pcVar3 = cp + 1;
    do {
      cVar2 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar2 = cVar1;
      }
      pcVar3[-1] = cVar2;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void
ucase(register char *cp)
{
    if (cp) {
        while (*cp) {
            *cp = UPPER_CASE(*cp);
            cp++;
        }
    }
}